

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
duckdb::Connection::CreateScalarFunction<double,double>
          (Connection *this,string *name,_func_double_double *udf_func)

{
  string *in_RDI;
  LogicalType *in_stack_00000048;
  ClientContext *in_stack_00000050;
  scalar_function_t *in_stack_00000058;
  string *in_stack_00000060;
  scalar_function_t function;
  shared_ptr<duckdb::ClientContext,_true> *in_stack_ffffffffffffff60;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *this_00;
  LogicalType local_80 [72];
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> local_38;
  
  this_00 = &local_38;
  UDFWrapper::CreateScalarFunction<double,double>
            (in_RDI,(_func_double_double *)in_stack_ffffffffffffff60);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (this_00,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                      *)in_RDI);
  shared_ptr<duckdb::ClientContext,_true>::operator*(in_stack_ffffffffffffff60);
  duckdb::LogicalType::LogicalType(local_80,INVALID);
  UDFWrapper::RegisterFunction<double,double>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  duckdb::LogicalType::~LogicalType(local_80);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x4d56a7);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0x4d56b1);
  return;
}

Assistant:

void CreateScalarFunction(const string &name, TR (*udf_func)(ARGS...)) {
		scalar_function_t function = UDFWrapper::CreateScalarFunction<TR, ARGS...>(name, udf_func);
		UDFWrapper::RegisterFunction<TR, ARGS...>(name, function, *context);
	}